

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::Serializer::AddPrefixBuffer(Serializer *this,uint64_t prefix,ByteData *buffer)

{
  uint uVar1;
  size_type sVar2;
  undefined8 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  string *in_stack_ffffffffffffff50;
  CfdException *this_01;
  undefined1 local_81 [49];
  CfdSourceLocation local_50;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  ByteData *buffer_local;
  uint64_t prefix_local;
  Serializer *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buffer;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,buffer);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (uVar1 < sVar2) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x18d;
    local_50.funcname = "AddPrefixBuffer";
    logger::warn<>(&local_50,"It exceeds the handling size.");
    uVar3 = __cxa_allocate_exception(0x30);
    this_01 = (CfdException *)local_81;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_81 + 1),"It exceeds the handling size.",(allocator *)this_01);
    CfdException::CfdException(this_01,(CfdError)((ulong)uVar3 >> 0x20),in_stack_ffffffffffffff50);
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e6fba);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  AddPrefixBuffer(this,prefix,(uint8_t *)this_00,(uint32_t)sVar2);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return;
}

Assistant:

void Serializer::AddPrefixBuffer(uint64_t prefix, const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddPrefixBuffer(prefix, buf.data(), static_cast<uint32_t>(buf.size()));
}